

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O2

void __thiscall
InsertProxyModelPrivate::InsertProxyModelPrivate(InsertProxyModelPrivate *this,InsertProxyModel *q)

{
  InsertProxyModel *pIVar1;
  undefined4 *puVar2;
  undefined4 in_stack_ffffffffffffff6c;
  RolesContainer starHeader;
  int local_6c;
  Connection local_68;
  QArrayDataPointer<char16_t> local_60;
  enable_if_t<std::is_copy_constructible_v<QString>,_QVariant> local_48;
  
  (this->m_insertDirection).i = 0;
  (this->m_sourceConnections).d.d = (Data *)0x0;
  (this->m_sourceConnections).d.ptr = (Connection *)0x0;
  (this->m_sourceConnections).d.size = 0;
  memset(&this->m_layoutChangePersistentIndexes,0,0xa9);
  this->q_ptr = q;
  starHeader.d.d =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
        )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
          *)0x0;
  local_6c = 0;
  QString::QString((QString *)&local_60,(QChar)0x2a);
  ::QVariant::fromValue<QString>(&local_48,(QString *)&local_60);
  QMap<int,_QVariant>::insert(&starHeader,&local_6c,&local_48);
  ::QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  ::operator=(&this->m_extraHeaderData[1].d,&starHeader.d);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  ::operator=(&this->m_extraHeaderData[0].d,&starHeader.d);
  pIVar1 = this->q_ptr;
  local_48.d.data.shared = (PrivateShared *)InsertProxyModel::extraDataChanged;
  local_48.d.data._8_8_ = 0;
  puVar2 = (undefined4 *)operator_new(0x18);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:217:22),_3,_QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&,_const_QList<int>_&>,_void>
       ::impl;
  *(InsertProxyModelPrivate **)(puVar2 + 4) = this;
  QObject::connectImpl
            ((QObject *)&local_68,(void **)pIVar1,(QObject *)&local_48,(void **)pIVar1,
             (QSlotObjectBase *)0x0,(ConnectionType)puVar2,
             (int *)CONCAT44(in_stack_ffffffffffffff6c,1),(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(&local_68);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&starHeader.d);
  return;
}

Assistant:

InsertProxyModelPrivate::InsertProxyModelPrivate(InsertProxyModel *q)
    : q_ptr(q)
    , m_insertDirection(InsertProxyModel::NoInsert)
    , m_separateEditDisplay(false)
{
    Q_ASSERT(q_ptr);
    RolesContainer starHeader;
    starHeader.insert(Qt::DisplayRole, QVariant::fromValue(QString(QLatin1Char('*'))));
    m_extraHeaderData[true] = starHeader;
    m_extraHeaderData[false] = starHeader;
    QObject::connect(q_ptr, &InsertProxyModel::extraDataChanged,
                     [this](const QModelIndex &topLeft, const QModelIndex &bottomRight, const QVector<int> &roles) -> void {
                         checkExtraDataChanged(topLeft, bottomRight, roles);
                     });
}